

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::remap_sampler_handle
          (Impl *this,VkSampler sampler,VkSampler *out_sampler)

{
  bool bVar1;
  LogLevel LVar2;
  pointer pvVar3;
  VkSampler_T *pVVar4;
  _Node_iterator_base<std::pair<VkSampler_T_*const,_unsigned_long>,_false> local_38;
  _Node_iterator_base<std::pair<VkSampler_T_*const,_unsigned_long>,_false> local_30;
  const_iterator itr;
  VkSampler *out_sampler_local;
  VkSampler sampler_local;
  Impl *this_local;
  
  itr.super__Node_iterator_base<std::pair<VkSampler_T_*const,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<VkSampler_T_*const,_unsigned_long>,_false>)
       (_Node_iterator_base<std::pair<VkSampler_T_*const,_unsigned_long>,_false>)out_sampler;
  out_sampler_local = (VkSampler *)sampler;
  sampler_local = (VkSampler)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<VkSampler_T_*,_unsigned_long,_std::hash<VkSampler_T_*>,_std::equal_to<VkSampler_T_*>,_std::allocator<std::pair<VkSampler_T_*const,_unsigned_long>_>_>
       ::find(&this->sampler_to_hash,(key_type *)&out_sampler_local);
  local_38._M_cur =
       (__node_type *)
       std::
       end<std::unordered_map<VkSampler_T*,unsigned_long,std::hash<VkSampler_T*>,std::equal_to<VkSampler_T*>,std::allocator<std::pair<VkSampler_T*const,unsigned_long>>>>
                 (&this->sampler_to_hash);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    LVar2 = get_thread_log_level();
    if (((int)LVar2 < 2) &&
       (bVar1 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Cannot find sampler in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                          ), !bVar1)) {
      fprintf(_stderr,
              "Fossilize WARN: Cannot find sampler in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
             );
    }
    this_local._7_1_ = false;
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<VkSampler_T_*const,_unsigned_long>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<VkSampler_T_*const,_unsigned_long>,_false,_false>
                         *)&local_30);
    pVVar4 = api_object_cast<VkSampler_T*,unsigned_long>(pvVar3->second);
    *(VkSampler_T **)
     itr.super__Node_iterator_base<std::pair<VkSampler_T_*const,_unsigned_long>,_false>._M_cur =
         pVVar4;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::remap_sampler_handle(VkSampler sampler, VkSampler *out_sampler) const
{
	auto itr = sampler_to_hash.find(sampler);
	if (itr == end(sampler_to_hash))
	{
		LOGW_LEVEL("Cannot find sampler in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_sampler = api_object_cast<VkSampler>(uint64_t(itr->second));
		return true;
	}
}